

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O3

void __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::compute_clock_valuation_from_dbm(clockval_dbm_t *this)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> clock_values;
  allocator_type local_49;
  rational<long> local_48;
  vector<int,_std::allocator<int>_> local_38;
  
  local_48.num = local_48.num & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(ulong)this->_dim,(value_type_conflict4 *)&local_48,&local_49);
  tchecker::dbm::satisfying_integer_valuation(this->_dbm,this->_dim,&local_38);
  if (this->_dim != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      local_48.num = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar2];
      local_48.den = (long)this->_denominator;
      boost::rational<long>::normalize(&local_48);
      if ((this->_clockval->super_clock_value_array_t).super_clockval_base_t.
          super_array_capacity_t<unsigned_short>._capacity <= (ushort)uVar2) {
        __assert_fail("i < BASE::_capacity",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/array.hh"
                      ,0xf1,
                      "T &tchecker::make_array_t<boost::rational<long>, 16, tchecker::clockval_base_t>::operator[](typename BASE::capacity_t) [T = boost::rational<long>, T_ALLOCSIZE = 16, BASE = tchecker::clockval_base_t]"
                     );
      }
      puVar1 = (ulong *)((long)&(this->_clockval->super_clock_value_array_t).super_clockval_base_t.
                                super_array_capacity_t<unsigned_short>._capacity + lVar3);
      *puVar1 = local_48.num;
      puVar1[1] = local_48.den;
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < this->_dim);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compute_clock_valuation_from_dbm()
  {
    std::vector<tchecker::integer_t> clock_values(_dim, 0);
    tchecker::dbm::satisfying_integer_valuation(_dbm, _dim, clock_values);
    for (tchecker::clock_id_t id = 0; id < _dim; ++id)
      (*_clockval)[id] = tchecker::clock_rational_value_t{clock_values[id], _denominator};
  }